

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void BackOneToken(Lexer *lexer)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = (long)lexer->previousTrackerSpot;
  lexer->previousTrackerSpot = lexer->previousTrackerSpot + -1;
  if (lVar2 < 1) {
    lexer->previousTrackerSpot = lexer->totalTrackers + -1;
  }
  (lexer->tracker).col = lexer->previousTrackers[lVar2].col;
  (lexer->tracker).currentTokenPosition = lexer->previousTrackers[lVar2].currentTokenPosition;
  (lexer->tracker).row = lexer->previousTrackers[lVar2].row;
  (lexer->tracker).tokenEnd = lexer->previousTrackers[lVar2].tokenEnd;
  (lexer->tracker).tokenStart = lexer->previousTrackers[lVar2].tokenStart;
  pcVar1 = GetTokenString(lexer);
  if (lexer->currentTokenString != (char *)0x0) {
    Free(lexer->currentTokenString);
  }
  lexer->currentTokenString = pcVar1;
  return;
}

Assistant:

void BackOneToken(Lexer* lexer){

	LexerTracker* previous = &lexer->previousTrackers[lexer->previousTrackerSpot];

	lexer->previousTrackerSpot--;
	if (lexer->previousTrackerSpot < 0) {
		lexer->previousTrackerSpot = lexer->totalTrackers - 1;
	}
	
	lexer->tracker.col = previous->col;
	lexer->tracker.currentTokenPosition = previous->currentTokenPosition;
	lexer->tracker.row = previous->row;
	lexer->tracker.tokenEnd = previous->tokenEnd;
	lexer->tracker.tokenStart = previous->tokenStart;

	char* token = GetTokenString(lexer);

	if (lexer->currentTokenString != NULL) {
		Free(lexer->currentTokenString);
	}

	lexer->currentTokenString = token;
}